

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_slerp(quaternion *start,quaternion *end,double percent,quaternion *qR)

{
  short sVar1;
  double dVar2;
  double dVar3;
  undefined1 local_78 [8];
  quaternion qneg;
  double s;
  double theta;
  double f2;
  double f1;
  double dot;
  quaternion *qR_local;
  double percent_local;
  quaternion *end_local;
  quaternion *start_local;
  
  sVar1 = scalar_equalsf(percent,0.0);
  if (sVar1 == 0) {
    sVar1 = scalar_equalsf(percent,1.0);
    if (sVar1 == 0) {
      dVar2 = quaternion_dot_product(start,end);
      sVar1 = scalar_equalsf(dVar2,1.0);
      if (sVar1 == 0) {
        if (0.0 <= dVar2) {
          HYP_CLAMP(dVar2,-1.0,1.0);
          dVar2 = acos(dVar2);
          qneg.field_0.q[3] = sin(dVar2);
          dVar3 = sin((1.0 - percent) * dVar2);
          dVar3 = dVar3 / qneg.field_0.q[3];
          dVar2 = sin(percent * dVar2);
          dVar2 = dVar2 / qneg.field_0.q[3];
          (qR->field_0).q[3] = dVar3 * (start->field_0).q[3] + dVar2 * (end->field_0).q[3];
          (qR->field_0).q[0] = dVar3 * (start->field_0).q[0] + dVar2 * (end->field_0).q[0];
          (qR->field_0).q[1] = dVar3 * (start->field_0).q[1] + dVar2 * (end->field_0).q[1];
          (qR->field_0).q[2] = dVar3 * (start->field_0).q[2] + dVar2 * (end->field_0).q[2];
        }
        else {
          quaternion_set((quaternion *)local_78,end);
          quaternion_negate((quaternion *)local_78);
          quaternion_slerp(start,(quaternion *)local_78,percent,qR);
          quaternion_negate(qR);
        }
      }
      else {
        quaternion_lerp(start,end,percent,qR);
      }
    }
    else {
      quaternion_set(qR,end);
    }
  }
  else {
    quaternion_set(qR,start);
  }
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_slerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT dot;
	HYP_FLOAT f1, f2;
	HYP_FLOAT theta;
	HYP_FLOAT s;
	struct quaternion qneg;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	/* how parallel are the quaternions (also the dot is the cosine) */
	dot = quaternion_dot_product(start, end);

	/* if they are close to parallel, use LERP
	 *	- This avoids div/0
	 *	- At small angles, the slerp and lerp are the same
	 */

	if (scalar_equalsf(dot, 1.0f)) {
		quaternion_lerp(start, end, percent, qR);
		return qR;
	}

	/* if dot is negative, they are "pointing" away from one another,
	 * use the shortest arc instead (reverse end and start)
	 * This has the effect of changing the direction of travel around
	 * the sphere beginning with "end" and going the other way around
	 * the sphere
	 */
	if (dot < 0.0f) {
		quaternion_set(&qneg, end);
		/*quaternion_conjugate(&qneg);*/
		quaternion_negate(&qneg);
		quaternion_slerp(start, &qneg, percent, qR);
		quaternion_negate(qR);
		/*quaternion_conjugate(qR);*/
		return qR;
	}

	/* keep the dot product in the range that acos can handle */
	/* (shouldn't get here) */
	HYP_CLAMP(dot, -1.0f, 1.0f);

	/* the angle between start and end in radians */
	theta = HYP_ACOS(dot);
	/* cache */
	s = HYP_SIN(theta);
	/* compute negative */
	f1 = HYP_SIN((1.0 - percent) * theta) / s;
	/* compute positive */
	f2 = HYP_SIN(percent * theta) / s;

	/* this expanded form avoids calling quaternion_multiply
	 * and quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}